

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

tuple<absl::CommandLineFlag_*,_bool>
absl::flags_internal::anon_unknown_0::LocateFlag(string_view flag_name)

{
  bool bVar1;
  CommandLineFlag *pCVar2;
  undefined1 uVar3;
  char *in_RCX;
  char *in_RDX;
  CommandLineFlag *extraout_RDX;
  CommandLineFlag *extraout_RDX_01;
  _Head_base<0UL,_absl::CommandLineFlag_*,_false> _Var4;
  undefined1 *puVar5;
  tuple<absl::CommandLineFlag_*,_bool> tVar6;
  string_view name;
  string_view name_00;
  string_view expected;
  string_view flag_name_local;
  CommandLineFlag *extraout_RDX_00;
  
  flag_name_local._M_len = (size_t)flag_name._M_str;
  puVar5 = (undefined1 *)flag_name._M_len;
  name._M_str = in_RDX;
  name._M_len = (size_t)in_RDX;
  flag_name_local._M_str = in_RDX;
  pCVar2 = FindCommandLineFlag((absl *)flag_name_local._M_len,name);
  if (pCVar2 == (CommandLineFlag *)0x0) {
    expected._M_str = in_RCX;
    expected._M_len = (size_t)"no";
    bVar1 = ConsumePrefix((absl *)&flag_name_local,(Nonnull<absl::string_view_*>)0x2,expected);
    if (bVar1) {
      name_00._M_str = (char *)extraout_RDX_00;
      name_00._M_len = (size_t)flag_name_local._M_str;
      pCVar2 = FindCommandLineFlag((absl *)flag_name_local._M_len,name_00);
      uVar3 = 1;
      _Var4._M_head_impl = extraout_RDX_01;
    }
    else {
      uVar3 = 0;
      pCVar2 = (CommandLineFlag *)0x0;
      _Var4._M_head_impl = extraout_RDX_00;
    }
  }
  else {
    uVar3 = 0;
    _Var4._M_head_impl = extraout_RDX;
  }
  *puVar5 = uVar3;
  *(CommandLineFlag **)(puVar5 + 8) = pCVar2;
  tVar6.super__Tuple_impl<0UL,_absl::CommandLineFlag_*,_bool>.
  super__Head_base<0UL,_absl::CommandLineFlag_*,_false>._M_head_impl = _Var4._M_head_impl;
  tVar6.super__Tuple_impl<0UL,_absl::CommandLineFlag_*,_bool>._0_8_ = puVar5;
  return (tuple<absl::CommandLineFlag_*,_bool>)
         tVar6.super__Tuple_impl<0UL,_absl::CommandLineFlag_*,_bool>;
}

Assistant:

std::tuple<CommandLineFlag*, bool> LocateFlag(absl::string_view flag_name) {
  CommandLineFlag* flag = absl::FindCommandLineFlag(flag_name);
  bool is_negative = false;

  if (!flag && absl::ConsumePrefix(&flag_name, "no")) {
    flag = absl::FindCommandLineFlag(flag_name);
    is_negative = true;
  }

  return std::make_tuple(flag, is_negative);
}